

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Amr.cpp
# Opt level: O0

void __thiscall
amrex::Amr::timeStep(Amr *this,int level,Real time,int iteration,int niter,Real stop_time)

{
  bool bVar1;
  int iVar2;
  pointer pAVar3;
  ulong uVar4;
  int *piVar5;
  double *pdVar6;
  Print *this_00;
  uint in_ECX;
  uint in_EDX;
  int in_ESI;
  long *in_RDI;
  double in_XMM0_Qa;
  double extraout_XMM0_Qa;
  double dVar7;
  double dVar8;
  undefined8 in_XMM1_Qa;
  int i_1;
  int ncycle;
  int lev_fine;
  int k_2;
  int old_finest_1;
  Real dt_new;
  int k_1;
  int k;
  int post_regrid_flag;
  int old_finest;
  int i;
  int lev_top;
  char (*in_stack_fffffffffffffb78) [19];
  undefined4 in_stack_fffffffffffffb80;
  undefined4 in_stack_fffffffffffffb84;
  undefined8 in_stack_fffffffffffffb90;
  Amr *in_stack_fffffffffffffb98;
  ostream *in_stack_fffffffffffffba8;
  Print *in_stack_fffffffffffffbb0;
  Real in_stack_fffffffffffffbb8;
  Amr *in_stack_fffffffffffffbc0;
  Print *in_stack_fffffffffffffbf0;
  double local_400;
  int local_38c;
  int local_380;
  double local_1e8;
  int local_1e0;
  int local_48;
  int local_44;
  int local_40;
  undefined4 local_3c;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  undefined8 local_28;
  uint local_20;
  uint local_1c;
  double local_18;
  int local_c;
  
  *(int *)(in_RDI + 0x58) = in_ESI;
  local_28 = in_XMM1_Qa;
  local_20 = in_ECX;
  local_1c = in_EDX;
  local_18 = in_XMM0_Qa;
  local_c = in_ESI;
  Vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
  ::operator[]((Vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
               (size_type)in_stack_fffffffffffffb78);
  pAVar3 = std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>::operator->
                     ((unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_> *)
                      0x10ea5ff);
  AmrLevel::setPostStepRegrid(pAVar3,0);
  if ((*(int *)((long)in_RDI + 0xc) == 0) && ((anonymous_namespace)::regrid_on_restart != 0)) {
    (**(code **)(*in_RDI + 0x80))();
  }
  else {
    local_30 = *(int *)((long)in_RDI + 0xc) + -1;
    piVar5 = std::min<int>((int *)((long)in_RDI + 0x94),&local_30);
    local_2c = *piVar5;
    for (local_34 = local_c; local_34 <= local_2c; local_34 = local_34 + 1) {
      local_38 = *(int *)((long)in_RDI + 0x94);
      bVar1 = okToRegrid(in_stack_fffffffffffffb98,(int)((ulong)in_stack_fffffffffffffb90 >> 0x20));
      if (bVar1) {
        (**(code **)(*in_RDI + 0x38))(local_18,in_RDI,local_34,0);
        if ((compute_new_dt_on_regrid != 0) && (local_34 == 0)) {
          local_3c = 1;
          Vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
          ::operator[]((Vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                        *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                       (size_type)in_stack_fffffffffffffb78);
          pAVar3 = std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>::
                   operator->((unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_> *)
                              0x10ea71d);
          in_stack_fffffffffffffb78 = (char (*) [19])(in_RDI + 0x2a);
          in_stack_fffffffffffffb80 = local_3c;
          (*pAVar3->_vptr_AmrLevel[0xe])
                    (local_28,pAVar3,(ulong)*(uint *)((long)in_RDI + 0x94),
                     (ulong)*(uint *)(in_RDI + 0x120),in_RDI + 0x33,in_RDI + 2,in_RDI + 0x3a);
        }
        for (local_40 = local_34; local_40 <= *(int *)((long)in_RDI + 0x94); local_40 = local_40 + 1
            ) {
          piVar5 = Vector<int,_std::allocator<int>_>::operator[]
                             ((Vector<int,_std::allocator<int>_> *)
                              CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                              (size_type)in_stack_fffffffffffffb78);
          *piVar5 = 0;
        }
        iVar2 = local_38;
        if (local_38 < *(int *)((long)in_RDI + 0x94)) {
          while (local_44 = iVar2 + 1, local_44 <= *(int *)((long)in_RDI + 0x94)) {
            pdVar6 = Vector<double,_std::allocator<double>_>::operator[]
                               ((Vector<double,_std::allocator<double>_> *)
                                CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                                (size_type)in_stack_fffffffffffffb78);
            dVar7 = *pdVar6;
            piVar5 = Vector<int,_std::allocator<int>_>::operator[]
                               ((Vector<int,_std::allocator<int>_> *)
                                CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                                (size_type)in_stack_fffffffffffffb78);
            iVar2 = *piVar5;
            pdVar6 = Vector<double,_std::allocator<double>_>::operator[]
                               ((Vector<double,_std::allocator<double>_> *)
                                CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                                (size_type)in_stack_fffffffffffffb78);
            *pdVar6 = dVar7 / (double)iVar2;
            iVar2 = local_44;
          }
        }
      }
      if (*(int *)((long)in_RDI + 0x94) < local_38) {
        local_48 = *(int *)((long)in_RDI + 0xc) + -1;
        piVar5 = std::min<int>((int *)((long)in_RDI + 0x94),&local_48);
        local_2c = *piVar5;
      }
    }
    if ((((*(int *)((long)in_RDI + 0xc) == 0) && (0 < *(int *)((long)in_RDI + 0x97c))) &&
        ((int)in_RDI[0x12f] != 0)) &&
       ((piVar5 = Vector<int,_std::allocator<int>_>::operator[]
                            ((Vector<int,_std::allocator<int>_> *)
                             CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                             (size_type)in_stack_fffffffffffffb78), *piVar5 == 1 ||
        (piVar5 = Vector<int,_std::allocator<int>_>::operator[]
                            ((Vector<int,_std::allocator<int>_> *)
                             CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                             (size_type)in_stack_fffffffffffffb78),
        *(int *)((long)in_RDI + 0x97c) <= *piVar5)))) {
      LoadBalanceLevel0(in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
      piVar5 = Vector<int,_std::allocator<int>_>::operator[]
                         ((Vector<int,_std::allocator<int>_> *)
                          CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                          (size_type)in_stack_fffffffffffffb78);
      *piVar5 = 0;
    }
  }
  if (((anonymous_namespace)::plotfile_on_restart != 0) &&
     (uVar4 = std::__cxx11::string::empty(), (uVar4 & 1) == 0)) {
    (anonymous_namespace)::plotfile_on_restart = 0;
    (**(code **)(*in_RDI + 0x68))();
  }
  if (0 < (int)in_RDI[1]) {
    OutStream();
    Print::Print(in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
    Print::operator<<((Print *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                      (char (*) [8])in_stack_fffffffffffffb78);
    Print::operator<<((Print *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                      (int *)in_stack_fffffffffffffb78);
    Print::operator<<((Print *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                      (char (*) [7])in_stack_fffffffffffffb78);
    piVar5 = Vector<int,_std::allocator<int>_>::operator[]
                       ((Vector<int,_std::allocator<int>_> *)
                        CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                        (size_type)in_stack_fffffffffffffb78);
    local_1e0 = *piVar5 + 1;
    Print::operator<<((Print *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                      (int *)in_stack_fffffffffffffb78);
    Print::operator<<((Print *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                      (char (*) [3])in_stack_fffffffffffffb78);
    Print::operator<<((Print *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                      in_stack_fffffffffffffb78);
    Vector<double,_std::allocator<double>_>::operator[]
              ((Vector<double,_std::allocator<double>_> *)
               CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
               (size_type)in_stack_fffffffffffffb78);
    Print::operator<<((Print *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                      (double *)in_stack_fffffffffffffb78);
    Print::operator<<((Print *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                      (char (*) [2])in_stack_fffffffffffffb78);
    Print::~Print(in_stack_fffffffffffffbf0);
  }
  Vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
  ::operator[]((Vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
               (size_type)in_stack_fffffffffffffb78);
  pAVar3 = std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>::operator->
                     ((unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_> *)
                      0x10eabc9);
  dVar7 = local_18;
  pdVar6 = Vector<double,_std::allocator<double>_>::operator[]
                     ((Vector<double,_std::allocator<double>_> *)
                      CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                      (size_type)in_stack_fffffffffffffb78);
  (*pAVar3->_vptr_AmrLevel[0xf])(dVar7,*pdVar6,pAVar3,(ulong)local_1c,(ulong)local_20);
  local_400 = extraout_XMM0_Qa;
  if (local_1c != 1) {
    pdVar6 = Vector<double,_std::allocator<double>_>::operator[]
                       ((Vector<double,_std::allocator<double>_> *)
                        CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                        (size_type)in_stack_fffffffffffffb78);
    pdVar6 = std::min<double>(pdVar6,&local_1e8);
    local_400 = *pdVar6;
  }
  pdVar6 = Vector<double,_std::allocator<double>_>::operator[]
                     ((Vector<double,_std::allocator<double>_> *)
                      CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                      (size_type)in_stack_fffffffffffffb78);
  *pdVar6 = local_400;
  piVar5 = Vector<int,_std::allocator<int>_>::operator[]
                     ((Vector<int,_std::allocator<int>_> *)
                      CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                      (size_type)in_stack_fffffffffffffb78);
  *piVar5 = *piVar5 + 1;
  piVar5 = Vector<int,_std::allocator<int>_>::operator[]
                     ((Vector<int,_std::allocator<int>_> *)
                      CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                      (size_type)in_stack_fffffffffffffb78);
  *piVar5 = *piVar5 + 1;
  if (0 < (int)in_RDI[1]) {
    OutStream();
    Print::Print(in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
    this_00 = Print::operator<<((Print *)CONCAT44(in_stack_fffffffffffffb84,
                                                  in_stack_fffffffffffffb80),
                                (char (*) [8])in_stack_fffffffffffffb78);
    Print::operator<<((Print *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                      (int *)in_stack_fffffffffffffb78);
    Print::operator<<((Print *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                      (char (*) [7])in_stack_fffffffffffffb78);
    Vector<int,_std::allocator<int>_>::operator[]
              ((Vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
               (size_type)in_stack_fffffffffffffb78);
    Print::operator<<((Print *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                      (int *)in_stack_fffffffffffffb78);
    Print::operator<<((Print *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                      (char (*) [3])in_stack_fffffffffffffb78);
    Print::operator<<((Print *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                      (char (*) [10])in_stack_fffffffffffffb78);
    Vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
    ::operator[]((Vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                  *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                 (size_type)in_stack_fffffffffffffb78);
    std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>::operator->
              ((unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_> *)0x10eae05);
    AmrLevel::countCells((AmrLevel *)0x10eae0d);
    Print::operator<<((Print *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                      (long *)in_stack_fffffffffffffb78);
    Print::operator<<((Print *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                      (char (*) [8])in_stack_fffffffffffffb78);
    Print::~Print(this_00);
  }
  Vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
  ::operator[]((Vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
               (size_type)in_stack_fffffffffffffb78);
  pAVar3 = std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>::operator->
                     ((unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_> *)
                      0x10eae9a);
  iVar2 = AmrLevel::postStepRegrid(pAVar3);
  if (iVar2 != 0) {
    local_380 = *(int *)((long)in_RDI + 0x94);
    (**(code **)(*in_RDI + 0x38))(local_18,in_RDI,local_c,0);
    if (local_380 < *(int *)((long)in_RDI + 0x94)) {
      while (local_380 = local_380 + 1, local_380 <= *(int *)((long)in_RDI + 0x94)) {
        pdVar6 = Vector<double,_std::allocator<double>_>::operator[]
                           ((Vector<double,_std::allocator<double>_> *)
                            CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                            (size_type)in_stack_fffffffffffffb78);
        dVar7 = *pdVar6;
        piVar5 = Vector<int,_std::allocator<int>_>::operator[]
                           ((Vector<int,_std::allocator<int>_> *)
                            CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                            (size_type)in_stack_fffffffffffffb78);
        dVar7 = dVar7 / (double)*piVar5;
        pdVar6 = Vector<double,_std::allocator<double>_>::operator[]
                           ((Vector<double,_std::allocator<double>_> *)
                            CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                            (size_type)in_stack_fffffffffffffb78);
        *pdVar6 = dVar7;
      }
    }
  }
  if (local_c < *(int *)((long)in_RDI + 0x94)) {
    if ((int)in_RDI[0x120] == 0) {
      (**(code **)(*in_RDI + 0x88))(local_18,local_28,in_RDI,local_c + 1,1);
    }
    else {
      piVar5 = Vector<int,_std::allocator<int>_>::operator[]
                         ((Vector<int,_std::allocator<int>_> *)
                          CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                          (size_type)in_stack_fffffffffffffb78);
      iVar2 = *piVar5;
      for (local_38c = 1; local_38c <= iVar2; local_38c = local_38c + 1) {
        dVar8 = (double)(local_38c + -1);
        dVar7 = local_18;
        pdVar6 = Vector<double,_std::allocator<double>_>::operator[]
                           ((Vector<double,_std::allocator<double>_> *)
                            CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                            (size_type)in_stack_fffffffffffffb78);
        (**(code **)(*in_RDI + 0x88))
                  (dVar8 * *pdVar6 + dVar7,local_28,in_RDI,local_c + 1,local_38c,iVar2);
      }
    }
  }
  Vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
  ::operator[]((Vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
               (size_type)in_stack_fffffffffffffb78);
  pAVar3 = std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>::operator->
                     ((unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_> *)
                      0x10eb13c);
  (*pAVar3->_vptr_AmrLevel[0x10])(pAVar3,(ulong)local_1c);
  *(undefined4 *)(in_RDI + 0x58) = 0xffffffff;
  return;
}

Assistant:

void
Amr::timeStep (int  level,
               Real time,
               int  iteration,
               int  niter,
               Real stop_time)
{
    BL_PROFILE("Amr::timeStep()");
    BL_COMM_PROFILE_NAMETAG("Amr::timeStep TOP");

    // This is used so that the AmrLevel functions can know which level is being advanced
    //      when regridding is called with possible lbase > level.
    which_level_being_advanced = level;


    // Update so that by default, we don't force a post-step regrid.
    amr_level[level]->setPostStepRegrid(0);

    //
    // Allow regridding of level 0 calculation on restart.
    //
    if (max_level == 0 && regrid_on_restart)
    {
        regrid_level_0_on_restart();
    }
    else
    {
        int lev_top = std::min(finest_level, max_level-1);
        for (int i(level); i <= lev_top; ++i)
        {
            const int old_finest = finest_level;

            if (okToRegrid(i))
            {
                regrid(i,time);

                //
                // Compute new dt after regrid if at level 0 and compute_new_dt_on_regrid.
                //
                if ( compute_new_dt_on_regrid && (i == 0) )
                {
                    int post_regrid_flag = 1;
                    amr_level[0]->computeNewDt(finest_level,
                                               sub_cycle,
                                               n_cycle,
                                               ref_ratio,
                                               dt_min,
                                               dt_level,
                                               stop_time,
                                               post_regrid_flag);
                }

                for (int k(i); k <= finest_level; ++k) {
                    level_count[k] = 0;
                }

                if (old_finest < finest_level)
                {
                    //
                    // The new levels will not have valid time steps
                    // and iteration counts.
                    //
                    for (int k(old_finest + 1); k <= finest_level; ++k)
                    {
                        dt_level[k]    = dt_level[k-1]/n_cycle[k];
                    }
                }
            }
            if (old_finest > finest_level) {
                lev_top = std::min(finest_level, max_level - 1);
            }
        }

        if (max_level == 0 && loadbalance_level0_int > 0 && loadbalance_with_workestimates)
        {
            if (level_steps[0] == 1 || level_count[0] >= loadbalance_level0_int) {
                LoadBalanceLevel0(time);
                level_count[0] = 0;
            }
        }
    }
    //
    // Check to see if should write plotfile.
    // This routine is here so it is done after the restart regrid.
    //
    if (plotfile_on_restart && ! (restart_chkfile.empty()) )
    {
        plotfile_on_restart = 0;
        writePlotFile();
    }
    //
    // Advance grids at this level.
    //
    if (verbose > 0)
    {
        amrex::Print() << "[Level " << level << " step " << level_steps[level]+1 << "] "
                       << "ADVANCE with dt = " << dt_level[level] << "\n";
    }

    Real dt_new = amr_level[level]->advance(time,dt_level[level],iteration,niter);
    BL_PROFILE_REGION_STOP("amr_level.advance");

    dt_min[level] = iteration == 1 ? dt_new : std::min(dt_min[level],dt_new);

    level_steps[level]++;
    level_count[level]++;

    if (verbose > 0)
    {
        amrex::Print() << "[Level " << level << " step " << level_steps[level] << "] "
                       << "Advanced " << amr_level[level]->countCells() << " cells\n";
    }

    // If the level signified that it wants a regrid after the advance has
    // occurred, do that now.
    if (amr_level[level]->postStepRegrid()) {

        int old_finest = finest_level;

        regrid(level, time);

        if (old_finest < finest_level)
        {
            //
            // The new levels will not have valid time steps.
            //
            for (int k = old_finest + 1; k <= finest_level; ++k)
            {
                dt_level[k] = dt_level[k-1] / n_cycle[k];
            }
        }
    }

    //
    // Advance grids at higher level.
    //
    if (level < finest_level)
    {
        const int lev_fine = level+1;

        if (sub_cycle)
        {
            const int ncycle = n_cycle[lev_fine];

            BL_COMM_PROFILE_NAMETAG("Amr::timeStep timeStep subcycle");
            for (int i = 1; i <= ncycle; i++)
                timeStep(lev_fine,time+(i-1)*dt_level[lev_fine],i,ncycle,stop_time);
        }
        else
        {
            BL_COMM_PROFILE_NAMETAG("Amr::timeStep timeStep nosubcycle");
            timeStep(lev_fine,time,1,1,stop_time);
        }
    }

    amr_level[level]->post_timestep(iteration);

    // Set this back to negative so we know whether we are in fact in this routine
    which_level_being_advanced = -1;
}